

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void anon_unknown.dwarf_47d6a9::checkForInvalidNestedConfigNodes
               (ASTContext *context,InstanceOverride *node,ConfigBlockSymbol *configBlock)

{
  SourceRange sourceRange;
  SourceRange range;
  bool bVar1;
  InstanceOverride *in_RDX;
  ASTContext *in_RSI;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_RDI;
  type *child;
  type *_;
  const_iterator __end1;
  const_iterator __begin1;
  flat_hash_map<std::string_view,_InstanceOverride> *__range1;
  Diagnostic *diag;
  ConfigBlockSymbol *in_stack_ffffffffffffff48;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  *in_stack_ffffffffffffff50;
  Diagnostic *in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  SourceLocation in_stack_ffffffffffffff78;
  DiagCode in_stack_ffffffffffffff84;
  pointer in_stack_ffffffffffffffa0;
  ConfigBlockSymbol *in_stack_ffffffffffffffe0;
  
  if (in_RSI->assertionInstance != (AssertionInstanceDetails *)0x0) {
    *(undefined1 *)
     &(in_RSI->assertionInstance->localVars).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
      .arrays.elements_ = 1;
    slang::not_null<const_slang::syntax::SyntaxNode_*>::operator->
              ((not_null<const_slang::syntax::SyntaxNode_*> *)0x36c671);
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffffa0);
    sourceRange.endLoc = in_stack_ffffffffffffff78;
    sourceRange.startLoc = in_stack_ffffffffffffff70;
    in_stack_ffffffffffffffe0 =
         (ConfigBlockSymbol *)
         slang::ast::ASTContext::addDiag
                   ((ASTContext *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff84,sourceRange);
    slang::ast::ConfigBlockSymbol::getTopCells(in_stack_ffffffffffffff48);
    std::span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::ConfigBlockSymbol::TopCell,_18446744073709551615UL> *)
               &stack0xffffffffffffffa0,0);
    range.endLoc = in_stack_ffffffffffffff78;
    range.startLoc = in_stack_ffffffffffffff70;
    slang::Diagnostic::addNote(in_stack_ffffffffffffff68,in_stack_ffffffffffffff84,range);
    in_stack_ffffffffffffff50 = in_RDI;
  }
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           *)0x36c72f);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
         *)0x36c743);
  while( true ) {
    bVar1 = boost::unordered::detail::foa::operator!=
                      (in_stack_ffffffffffffff50,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)0x36c76c);
    std::
    get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                *)0x36c77b);
    std::
    get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
              ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                *)0x36c78a);
    checkForInvalidNestedConfigNodes(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::operator++(in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void checkForInvalidNestedConfigNodes(const ASTContext& context,
                                      const ConfigBlockSymbol::InstanceOverride& node,
                                      const ConfigBlockSymbol& configBlock) {
    if (node.rule) {
        // Mark the rule as used so we don't also get a warning
        // about this rule when we're going to give a hard error anyway.
        node.rule->isUsed = true;

        auto& diag = context.addDiag(diag::ConfigInstanceUnderOtherConfig,
                                     node.rule->syntax->sourceRange());
        diag.addNote(diag::NoteConfigRule, configBlock.getTopCells()[0].sourceRange);
    }

    for (auto& [_, child] : node.childNodes)
        checkForInvalidNestedConfigNodes(context, child, configBlock);
}